

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::ParsedScene::ConcatTransform(ParsedScene *this,Float *tr,FileLoc loc)

{
  Transform *pTVar1;
  int i;
  uint i_00;
  span<const_float> t;
  Transform local_1f0;
  SquareMatrix<4> local_170;
  Transform local_130;
  Transform local_b0;
  
  if (this->currentApiState == Uninitialized) {
    Error<char_const(&)[16]>
              (&loc,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [16])"ConcatTransform");
  }
  else {
    for (i_00 = 0; i_00 != 2; i_00 = i_00 + 1) {
      if ((this->activeTransformBits >> (i_00 & 0x1f) & 1) != 0) {
        pTVar1 = TransformSet::operator[](&this->curTransform,i_00);
        t.n = 0x10;
        t.ptr = tr;
        SquareMatrix<4>::SquareMatrix(&local_170,t);
        pbrt::Transform::Transform(&local_130,&local_170);
        Transpose(&local_b0,&local_130);
        pbrt::Transform::operator*(&local_1f0,pTVar1,&local_b0);
        pTVar1 = TransformSet::operator[](&this->curTransform,i_00);
        *(undefined8 *)(pTVar1->m).m[0] = local_1f0.m.m[0]._0_8_;
        *(undefined8 *)((pTVar1->m).m[0] + 2) = local_1f0.m.m[0]._8_8_;
        *(undefined8 *)(pTVar1->m).m[1] = local_1f0.m.m[1]._0_8_;
        *(undefined8 *)((pTVar1->m).m[1] + 2) = local_1f0.m.m[1]._8_8_;
        *(undefined8 *)(pTVar1->m).m[2] = local_1f0.m.m[2]._0_8_;
        *(undefined8 *)((pTVar1->m).m[2] + 2) = local_1f0.m.m[2]._8_8_;
        *(undefined8 *)(pTVar1->m).m[3] = local_1f0.m.m[3]._0_8_;
        *(undefined8 *)((pTVar1->m).m[3] + 2) = local_1f0.m.m[3]._8_8_;
        *(undefined8 *)(pTVar1->mInv).m[0] = local_1f0.mInv.m[0]._0_8_;
        *(undefined8 *)((pTVar1->mInv).m[0] + 2) = local_1f0.mInv.m[0]._8_8_;
        *(undefined8 *)(pTVar1->mInv).m[1] = local_1f0.mInv.m[1]._0_8_;
        *(undefined8 *)((pTVar1->mInv).m[1] + 2) = local_1f0.mInv.m[1]._8_8_;
        *(undefined8 *)(pTVar1->mInv).m[2] = local_1f0.mInv.m[2]._0_8_;
        *(undefined8 *)((pTVar1->mInv).m[2] + 2) = local_1f0.mInv.m[2]._8_8_;
        *(undefined8 *)(pTVar1->mInv).m[3] = local_1f0.mInv.m[3]._0_8_;
        *(undefined8 *)((pTVar1->mInv).m[3] + 2) = local_1f0.mInv.m[3]._8_8_;
      }
    }
  }
  return;
}

Assistant:

void ParsedScene::ConcatTransform(Float tr[16], FileLoc loc) {
    VERIFY_INITIALIZED("ConcatTransform");
    FOR_ACTIVE_TRANSFORMS(curTransform[i] =
                              curTransform[i] * Transpose(pbrt::Transform(SquareMatrix<4>(
                                                    pstd::MakeSpan(tr, 16))));)
}